

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNumberTreeObjectHelper.cc
# Opt level: O3

iterator * __thiscall
QPDFNumberTreeObjectHelper::find
          (iterator *__return_storage_ptr__,QPDFNumberTreeObjectHelper *this,numtree_number key,
          bool return_prev_if_not_found)

{
  NNTreeImpl *this_00;
  iterator i;
  undefined1 local_a1;
  NNTreeIterator *local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  QPDFObjectHandle local_90;
  iterator local_80;
  
  this_00 = (((this->m).
              super___shared_ptr<QPDFNumberTreeObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->impl).super___shared_ptr<NNTreeImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  QPDFObjectHandle::newInteger(&local_90,key);
  NNTreeImpl::find(&local_80,this_00,&local_90,return_prev_if_not_found);
  if (local_90.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  local_a0 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<NNTreeIterator,std::allocator<NNTreeIterator>,NNTreeIterator&>
            (&local_98,&local_a0,(allocator<NNTreeIterator> *)&local_a1,&local_80);
  __return_storage_ptr__->_vptr_iterator = (_func_int **)&PTR__iterator_002ed8f8;
  (__return_storage_ptr__->impl).super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_a0;
  (__return_storage_ptr__->impl).super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_98._M_pi;
  if (local_98._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (__return_storage_ptr__->ivalue).first = 0;
    (__return_storage_ptr__->ivalue).second.super_BaseHandle.obj.
    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->ivalue).second.super_BaseHandle.obj.
    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_98._M_pi)->_M_use_count = (local_98._M_pi)->_M_use_count + 1;
      UNLOCK();
      (__return_storage_ptr__->ivalue).first = 0;
      (__return_storage_ptr__->ivalue).second.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      (__return_storage_ptr__->ivalue).second.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (local_98._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_001bd0c9;
    }
    else {
      (local_98._M_pi)->_M_use_count = (local_98._M_pi)->_M_use_count + 1;
      (__return_storage_ptr__->ivalue).first = 0;
      (__return_storage_ptr__->ivalue).second.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      (__return_storage_ptr__->ivalue).second.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98._M_pi);
  }
LAB_001bd0c9:
  NNTreeIterator::~NNTreeIterator(&local_80);
  return __return_storage_ptr__;
}

Assistant:

QPDFNumberTreeObjectHelper::iterator
QPDFNumberTreeObjectHelper::find(numtree_number key, bool return_prev_if_not_found)
{
    auto i = m->impl->find(QPDFObjectHandle::newInteger(key), return_prev_if_not_found);
    return {std::make_shared<NNTreeIterator>(i)};
}